

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationCoordinatesTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::tessellation::anon_unknown_0::TessCoordTestInstance::iterate
          (TestStatus *__return_storage_ptr__,TessCoordTestInstance *this)

{
  void **ppvVar1;
  ostringstream *this_00;
  SpacingMode SVar2;
  pointer pVVar3;
  pointer pVVar4;
  ProgramCollection<vk::ProgramBinary> *pPVar5;
  undefined8 *puVar6;
  TestLog *log;
  pointer pvVar7;
  undefined8 uVar8;
  pointer pvVar9;
  pointer pTVar10;
  VkDeviceSize __n;
  Allocation *pAVar11;
  bool bVar12;
  bool bVar13;
  deUint32 queueFamilyIndex;
  uint uVar14;
  int iVar15;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  ulong uVar16;
  DescriptorSetLayoutBuilder *pDVar17;
  DescriptorPoolBuilder *pDVar18;
  DescriptorSetUpdateBuilder *pDVar19;
  ProgramBinary *pPVar20;
  GraphicsPipelineBuilder *pGVar21;
  TestLog *pTVar22;
  TessPrimitiveType TVar23;
  uint uVar24;
  pointer pvVar25;
  Surface *pSVar26;
  pointer pvVar27;
  void *__buf;
  void *__buf_00;
  TestStatus *pTVar28;
  float *outerLevels;
  int j;
  long lVar29;
  ulong uVar30;
  int tessLevelCaseNdx;
  uint uVar31;
  long lVar32;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *coords;
  undefined1 auVar33 [16];
  allocator<char> local_67a;
  allocator<char> local_679;
  vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
  tessLevelCases;
  RefBase<vk::VkCommandBuffer_s_*> local_648;
  TestStatus *local_628;
  VkDeviceSize local_620;
  vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
  allReferenceTessCoords;
  Surface resVisual;
  Surface refVisual;
  string local_5d0;
  VkQueue local_5b0;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *local_5a8;
  ulong local_5a0;
  string local_598;
  VkBufferMemoryBarrier shaderWriteBarrier;
  RefBase<vk::Handle<(vk::HandleType)17>_> local_3f8;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_3d8;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> resultTessCoords;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_398;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_378;
  VkDescriptorBufferInfo resultBufferInfo;
  VkDescriptorBufferInfo tessLevelsBufferInfo;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_328;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_308;
  RefBase<vk::Handle<(vk::HandleType)23>_> local_2e8;
  RefBase<vk::Handle<(vk::HandleType)21>_> local_2c8;
  Buffer resultBuffer;
  int inner;
  deUint32 dStack_274;
  Buffer tessLevelsBuffer;
  int outer [3];
  int iStack_1ac;
  
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_5b0 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  SVar2 = this->m_spacingMode;
  local_628 = __return_storage_ptr__;
  if (SVar2 == SPACINGMODE_EQUAL) {
    std::vector<vkt::tessellation::TessLevels,std::allocator<vkt::tessellation::TessLevels>>::
    vector<vkt::tessellation::TessLevels_const*,void>
              ((vector<vkt::tessellation::TessLevels,std::allocator<vkt::tessellation::TessLevels>>
                *)&tessLevelCases,
               (TessLevels *)
               tessellation::(anonymous_namespace)::
               genTessLevelCases(vkt::tessellation::TessPrimitiveType,vkt::tessellation::SpacingMode)
               ::rawTessLevelCases,(TessLevels *)"winding",(allocator_type *)&shaderWriteBarrier);
  }
  else {
    TVar23 = this->m_primitiveType;
    tessLevelCases.
    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tessLevelCases.
    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    tessLevelCases.
    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>::
    reserve(&tessLevelCases,9);
    for (lVar32 = 0; lVar32 != 9; lVar32 = lVar32 + 1) {
      uVar16 = lVar32 * 0x18;
      shaderWriteBarrier._16_8_ =
           *(undefined8 *)
            (tessellation::(anonymous_namespace)::
             genTessLevelCases(vkt::tessellation::TessPrimitiveType,vkt::tessellation::SpacingMode)
             ::rawTessLevelCases + uVar16 + 0x10);
      shaderWriteBarrier._0_8_ =
           *(undefined8 *)
            (tessellation::(anonymous_namespace)::
             genTessLevelCases(vkt::tessellation::TessPrimitiveType,vkt::tessellation::SpacingMode)
             ::rawTessLevelCases + uVar16);
      shaderWriteBarrier.pNext =
           *(void **)(tessellation::(anonymous_namespace)::
                      genTessLevelCases(vkt::tessellation::TessPrimitiveType,vkt::tessellation::SpacingMode)
                      ::rawTessLevelCases + uVar16 + 8);
      for (lVar29 = 0; lVar29 != 2; lVar29 = lVar29 + 1) {
        uVar14 = getClampedRoundedTessLevel(SVar2,(float)(&shaderWriteBarrier.sType)[lVar29]);
        uVar16 = (ulong)uVar14;
        (&shaderWriteBarrier.sType)[lVar29] = (VkStructureType)(float)(int)uVar14;
      }
      for (lVar29 = 2; lVar29 != 6; lVar29 = lVar29 + 1) {
        uVar14 = getClampedRoundedTessLevel(SVar2,(float)(&shaderWriteBarrier.sType)[lVar29]);
        uVar16 = (ulong)uVar14;
        (&shaderWriteBarrier.sType)[lVar29] = (VkStructureType)(float)(int)uVar14;
      }
      if (TVar23 == TESSPRIMITIVETYPE_TRIANGLES) {
        if (((1.0 < (float)shaderWriteBarrier.srcAccessMask ||
              (1.0 < shaderWriteBarrier.pNext._4_4_ || 1.0 < shaderWriteBarrier.pNext._0_4_)) &&
            ((float)shaderWriteBarrier.sType == 1.0)) && (!NAN((float)shaderWriteBarrier.sType))) {
          iVar15 = getClampedRoundedTessLevel(SVar2,1.1);
          shaderWriteBarrier.sType = (VkStructureType)(float)iVar15;
        }
      }
      else if (TVar23 == TESSPRIMITIVETYPE_QUADS) {
        auVar33._4_4_ = -(uint)(1.0 < shaderWriteBarrier.pNext._4_4_);
        auVar33._0_4_ = -(uint)(1.0 < shaderWriteBarrier.pNext._0_4_);
        auVar33._8_4_ = -(uint)(1.0 < (float)shaderWriteBarrier.srcAccessMask);
        auVar33._12_4_ = -(uint)(1.0 < (float)shaderWriteBarrier.dstAccessMask);
        iVar15 = movmskps((int)uVar16,auVar33);
        if (iVar15 != 0) {
          if (((float)shaderWriteBarrier.sType == 1.0) && (!NAN((float)shaderWriteBarrier.sType))) {
            iVar15 = getClampedRoundedTessLevel(SVar2,1.1);
            shaderWriteBarrier.sType = (VkStructureType)(float)iVar15;
          }
          if (((float)shaderWriteBarrier._4_4_ == 1.0) && (!NAN((float)shaderWriteBarrier._4_4_))) {
            iVar15 = getClampedRoundedTessLevel(SVar2,1.1);
            shaderWriteBarrier._4_4_ = (float)iVar15;
          }
        }
      }
      std::vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>::
      push_back(&tessLevelCases,(value_type *)&shaderWriteBarrier);
    }
  }
  std::
  vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
  ::vector(&allReferenceTessCoords,
           ((long)tessLevelCases.
                  super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)tessLevelCases.
                 super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18,
           (allocator_type *)&shaderWriteBarrier);
  for (uVar14 = 0;
      pTVar10 = tessLevelCases.
                super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                ._M_impl.super__Vector_impl_data._M_start, uVar16 = (ulong)uVar14,
      uVar16 < (ulong)(((long)tessLevelCases.
                              super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)tessLevelCases.
                             super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar14 = uVar14 + 1
      ) {
    TVar23 = this->m_primitiveType;
    SVar2 = this->m_spacingMode;
    outerLevels = tessLevelCases.
                  super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar16].outer;
    bVar12 = isPatchDiscarded(TVar23,outerLevels);
    if (bVar12) {
LAB_006f103a:
      shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      shaderWriteBarrier._4_4_ = 0;
      shaderWriteBarrier.pNext = (void *)0x0;
      shaderWriteBarrier.srcAccessMask = 0;
      shaderWriteBarrier.dstAccessMask = 0;
    }
    else if (TVar23 == TESSPRIMITIVETYPE_ISOLINES) {
      getClampedRoundedIsolineTessLevels(SVar2,outerLevels,outer);
      generateReferenceIsolineTessCoords
                ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                 &shaderWriteBarrier,outer[0],outer[1]);
    }
    else if (TVar23 == TESSPRIMITIVETYPE_QUADS) {
      getClampedRoundedQuadTessLevels(SVar2,pTVar10[uVar16].inner,outerLevels,&inner,outer);
      generateReferenceQuadTessCoords
                ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                 &shaderWriteBarrier,SVar2,inner,dStack_274,outer[0],outer[1],
                 (int)stack0xfffffffffffffe50,iStack_1ac);
    }
    else {
      if (TVar23 != TESSPRIMITIVETYPE_TRIANGLES) goto LAB_006f103a;
      getClampedRoundedTriangleTessLevels(SVar2,pTVar10[uVar16].inner,outerLevels,&inner,outer);
      generateReferenceTriangleTessCoords
                ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                 &shaderWriteBarrier,SVar2,inner,outer[0],outer[1],outer[2]);
    }
    std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::_M_move_assign
              (allReferenceTessCoords.
               super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar16,&shaderWriteBarrier);
    std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~_Vector_base
              ((_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
               &shaderWriteBarrier);
  }
  pvVar27 = allReferenceTessCoords.
            super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar25 = allReferenceTessCoords.
            super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar7 = allReferenceTessCoords.
           super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (allReferenceTessCoords.
      super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      allReferenceTessCoords.
      super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    while (pvVar25 = pvVar27, pvVar27 = pvVar7 + 1,
          pvVar27 !=
          allReferenceTessCoords.
          super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
      pvVar9 = pvVar7 + 1;
      pvVar7 = pvVar27;
      if ((ulong)((long)(pvVar9->
                        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar27->
                       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) <=
          (ulong)((long)(pvVar25->
                        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar25->
                       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)) {
        pvVar27 = pvVar25;
      }
    }
  }
  pVVar3 = (pvVar25->
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pVVar4 = (pvVar25->
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  makeBufferCreateInfo((VkBufferCreateInfo *)&shaderWriteBarrier,0x18,0x20);
  tessellation::Buffer::Buffer
            (&tessLevelsBuffer,vk,device,allocator,(VkBufferCreateInfo *)&shaderWriteBarrier,
             (MemoryRequirement)0x1);
  local_620 = ((((long)pVVar3 - (long)pVVar4) / 0xc << 0x20) >> 0x1c) + 0x110;
  makeBufferCreateInfo((VkBufferCreateInfo *)&shaderWriteBarrier,local_620,0x20);
  tessellation::Buffer::Buffer
            (&resultBuffer,vk,device,allocator,(VkBufferCreateInfo *)&shaderWriteBarrier,
             (MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&shaderWriteBarrier);
  pDVar17 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      ((DescriptorSetLayoutBuilder *)&shaderWriteBarrier,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,2);
  pDVar17 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      (pDVar17,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,4);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)outer,pDVar17,vk,device,0);
  local_378.m_data.object.m_internal._0_4_ = outer[0];
  local_378.m_data.object.m_internal._4_4_ = outer[1];
  local_378.m_data.deleter.m_deviceIface = (DeviceInterface *)stack0xfffffffffffffe50;
  outer[0] = 0;
  outer[1] = 0;
  stack0xfffffffffffffe50 = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)outer);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&shaderWriteBarrier);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)outer);
  pDVar18 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)outer,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  pDVar18 = ::vk::DescriptorPoolBuilder::addType(pDVar18,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&shaderWriteBarrier,pDVar18,vk,device,1,1);
  local_2c8.m_data.deleter.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  local_2c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_2c8.m_data.object.m_internal = shaderWriteBarrier._0_8_;
  local_2c8.m_data.deleter.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderWriteBarrier._4_4_ = 0;
  shaderWriteBarrier.pNext = (void *)0x0;
  shaderWriteBarrier.srcAccessMask = 0;
  shaderWriteBarrier.dstAccessMask = 0;
  shaderWriteBarrier.srcQueueFamilyIndex = 0;
  shaderWriteBarrier.dstQueueFamilyIndex = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&shaderWriteBarrier);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )outer);
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&shaderWriteBarrier,vk,device,
                    (VkDescriptorPool)local_2c8.m_data.object.m_internal,
                    (VkDescriptorSetLayout)local_378.m_data.object.m_internal);
  local_3d8.m_data.deleter.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  local_3d8.m_data.deleter.m_pool.m_internal._0_4_ = shaderWriteBarrier.srcQueueFamilyIndex;
  local_3d8.m_data.deleter.m_pool.m_internal._4_4_ = shaderWriteBarrier.dstQueueFamilyIndex;
  local_3d8.m_data.object.m_internal = shaderWriteBarrier._0_8_;
  local_3d8.m_data.deleter.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderWriteBarrier._4_4_ = 0;
  shaderWriteBarrier.pNext = (void *)0x0;
  shaderWriteBarrier.srcAccessMask = 0;
  shaderWriteBarrier.dstAccessMask = 0;
  shaderWriteBarrier.srcQueueFamilyIndex = 0;
  shaderWriteBarrier.dstQueueFamilyIndex = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&shaderWriteBarrier);
  tessLevelsBufferInfo.buffer.m_internal =
       tessLevelsBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
       m_internal;
  tessLevelsBufferInfo.offset = 0;
  tessLevelsBufferInfo.range = 0x18;
  resultBufferInfo.buffer.m_internal =
       resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  resultBufferInfo.offset = 0;
  resultBufferInfo.range = local_620;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&shaderWriteBarrier);
  outer[0] = 0;
  outer[1] = 0;
  pDVar19 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      ((DescriptorSetUpdateBuilder *)&shaderWriteBarrier,
                       (VkDescriptorSet)local_3d8.m_data.object.m_internal,(Location *)outer,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,&tessLevelsBufferInfo);
  inner = 1;
  dStack_274 = 0;
  pDVar19 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (pDVar19,(VkDescriptorSet)local_3d8.m_data.object.m_internal,
                       (Location *)&inner,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,&resultBufferInfo);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar19,vk,device);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&shaderWriteBarrier);
  makeRenderPassWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&shaderWriteBarrier,vk,device);
  local_3f8.m_data.deleter.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  local_3f8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_3f8.m_data.object.m_internal = shaderWriteBarrier._0_8_;
  local_3f8.m_data.deleter.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderWriteBarrier._4_4_ = 0;
  shaderWriteBarrier.pNext = (void *)0x0;
  shaderWriteBarrier.srcAccessMask = 0;
  shaderWriteBarrier.dstAccessMask = 0;
  shaderWriteBarrier.srcQueueFamilyIndex = 0;
  shaderWriteBarrier.dstQueueFamilyIndex = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)17>_> *)&shaderWriteBarrier);
  makeFramebufferWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&shaderWriteBarrier,vk,device,
             (VkRenderPass)local_3f8.m_data.object.m_internal);
  local_2e8.m_data.deleter.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  local_2e8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_2e8.m_data.object.m_internal = shaderWriteBarrier._0_8_;
  local_2e8.m_data.deleter.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderWriteBarrier._4_4_ = 0;
  shaderWriteBarrier.pNext = (void *)0x0;
  shaderWriteBarrier.srcAccessMask = 0;
  shaderWriteBarrier.dstAccessMask = 0;
  shaderWriteBarrier.srcQueueFamilyIndex = 0;
  shaderWriteBarrier.dstQueueFamilyIndex = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&shaderWriteBarrier);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&shaderWriteBarrier,vk,device,
                     (VkDescriptorSetLayout)local_378.m_data.object.m_internal);
  local_398.m_data.deleter.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  local_398.m_data.deleter.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_398.m_data.object.m_internal = shaderWriteBarrier._0_8_;
  local_398.m_data.deleter.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderWriteBarrier._4_4_ = 0;
  shaderWriteBarrier.pNext = (void *)0x0;
  shaderWriteBarrier.srcAccessMask = 0;
  shaderWriteBarrier.dstAccessMask = 0;
  shaderWriteBarrier.srcQueueFamilyIndex = 0;
  shaderWriteBarrier.dstQueueFamilyIndex = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&shaderWriteBarrier);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&shaderWriteBarrier,vk,device,
                  queueFamilyIndex);
  local_308.m_data.deleter.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  local_308.m_data.deleter.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_308.m_data.object.m_internal = shaderWriteBarrier._0_8_;
  local_308.m_data.deleter.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderWriteBarrier._4_4_ = 0;
  shaderWriteBarrier.pNext = (void *)0x0;
  shaderWriteBarrier.srcAccessMask = 0;
  shaderWriteBarrier.dstAccessMask = 0;
  shaderWriteBarrier.srcQueueFamilyIndex = 0;
  shaderWriteBarrier.dstQueueFamilyIndex = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&shaderWriteBarrier);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&shaderWriteBarrier,vk,device,
             (VkCommandPool)local_308.m_data.object.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_648.m_data.deleter.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  local_648.m_data.deleter.m_pool.m_internal._0_4_ = shaderWriteBarrier.srcQueueFamilyIndex;
  local_648.m_data.deleter.m_pool.m_internal._4_4_ = shaderWriteBarrier.dstQueueFamilyIndex;
  local_648.m_data.object = (VkCommandBuffer_s *)shaderWriteBarrier._0_8_;
  local_648.m_data.deleter.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderWriteBarrier._4_4_ = 0;
  shaderWriteBarrier.pNext = (void *)0x0;
  shaderWriteBarrier.srcAccessMask = 0;
  shaderWriteBarrier.dstAccessMask = 0;
  shaderWriteBarrier.srcQueueFamilyIndex = 0;
  shaderWriteBarrier.dstQueueFamilyIndex = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&shaderWriteBarrier);
  memset(&shaderWriteBarrier,0,0xfc);
  pPVar5 = ((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&inner,"vert",(allocator<char> *)&refVisual);
  pPVar20 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar5,(string *)&inner);
  pGVar21 = GraphicsPipelineBuilder::setShader
                      ((GraphicsPipelineBuilder *)&shaderWriteBarrier,vk,device,
                       VK_SHADER_STAGE_VERTEX_BIT,pPVar20,(VkSpecializationInfo *)0x0);
  pPVar5 = ((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d0,"tesc",(allocator<char> *)&resVisual);
  pPVar20 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar5,&local_5d0);
  pGVar21 = GraphicsPipelineBuilder::setShader
                      (pGVar21,vk,device,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,pPVar20,
                       (VkSpecializationInfo *)0x0);
  pPVar5 = ((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_598,"tese",(allocator<char> *)&resultTessCoords);
  pPVar20 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar5,&local_598);
  pGVar21 = GraphicsPipelineBuilder::setShader
                      (pGVar21,vk,device,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,pPVar20,
                       (VkSpecializationInfo *)0x0);
  GraphicsPipelineBuilder::build
            ((Move<vk::Handle<(vk::HandleType)18>_> *)outer,pGVar21,vk,device,
             (VkPipelineLayout)local_398.m_data.object.m_internal,
             (VkRenderPass)local_3f8.m_data.object.m_internal);
  local_328.m_data.deleter.m_device = (VkDevice)0x0;
  local_328.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_328.m_data.object.m_internal._0_4_ = outer[0];
  local_328.m_data.object.m_internal._4_4_ = outer[1];
  local_328.m_data.deleter.m_deviceIface = (DeviceInterface *)stack0xfffffffffffffe50;
  outer[0] = 0;
  outer[1] = 0;
  stack0xfffffffffffffe50 = (pointer)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)outer);
  std::__cxx11::string::~string((string *)&local_598);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::__cxx11::string::~string((string *)&inner);
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder((GraphicsPipelineBuilder *)&shaderWriteBarrier);
  uVar14 = 0;
  uVar31 = 0;
  do {
    uVar30 = (ulong)uVar14;
    TVar23 = 0x18;
    uVar16 = ((long)tessLevelCases.
                    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)tessLevelCases.
                   super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x18;
    if (uVar16 <= uVar30) {
      if (uVar16 == uVar31) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&shaderWriteBarrier,"OK",(allocator<char> *)outer);
        pTVar28 = local_628;
        tcu::TestStatus::pass(local_628,(string *)&shaderWriteBarrier);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&shaderWriteBarrier,"Some cases have failed",(allocator<char> *)outer);
        pTVar28 = local_628;
        tcu::TestStatus::fail(local_628,(string *)&shaderWriteBarrier);
      }
      std::__cxx11::string::~string((string *)&shaderWriteBarrier);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_328);
      ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_648);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_308);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_398);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_2e8);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase(&local_3f8);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_3d8);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase(&local_2c8);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_378);
      tessellation::Buffer::~Buffer(&resultBuffer);
      tessellation::Buffer::~Buffer(&tessLevelsBuffer);
      std::
      vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
      ::~vector(&allReferenceTessCoords);
      std::
      _Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>::
      ~_Vector_base(&tessLevelCases.
                     super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                   );
      return pTVar28;
    }
    shaderWriteBarrier._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
    std::operator<<((ostream *)&shaderWriteBarrier.pNext,"Tessellation levels: ");
    local_5a0 = uVar30;
    getTessellationLevelsString_abi_cxx11_
              ((string *)outer,
               (tessellation *)
               (tessLevelCases.
                super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar30),
               (TessLevels *)(ulong)this->m_primitiveType,TVar23);
    std::operator<<((ostream *)&shaderWriteBarrier.pNext,(string *)outer);
    __n = local_620;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&shaderWriteBarrier,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)outer);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
    puVar6 = (undefined8 *)
             (tessLevelsBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr;
    puVar6[2] = *(undefined8 *)
                 (tessLevelCases.
                  super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar30].outer + 2);
    uVar8 = *(undefined8 *)
             tessLevelCases.
             super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar30].outer;
    *puVar6 = *(undefined8 *)
               tessLevelCases.
               super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar30].inner;
    puVar6[1] = uVar8;
    ::vk::flushMappedMemoryRange
              (vk,device,
               (VkDeviceMemory)
               ((tessLevelsBuffer.m_allocation.
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_memory).m_internal,
               (tessLevelsBuffer.m_allocation.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_offset,0x18);
    pAVar11 = resultBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
    memset((resultBuffer.m_allocation.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
           m_hostPtr,0,__n);
    ::vk::flushMappedMemoryRange
              (vk,device,(VkDeviceMemory)(pAVar11->m_memory).m_internal,pAVar11->m_offset,__n);
    beginCommandBuffer(vk,local_648.m_data.object);
    beginRenderPassWithRasterizationDisabled
              (vk,local_648.m_data.object,(VkRenderPass)local_3f8.m_data.object.m_internal,
               (VkFramebuffer)local_2e8.m_data.object.m_internal);
    (*vk->_vptr_DeviceInterface[0x4c])
              (vk,local_648.m_data.object,0,local_328.m_data.object.m_internal);
    (*vk->_vptr_DeviceInterface[0x56])
              (vk,local_648.m_data.object,0,local_398.m_data.object.m_internal,0,1,&local_3d8,0,0);
    (*vk->_vptr_DeviceInterface[0x59])(vk,local_648.m_data.object,1,1,0,0);
    endRenderPass(vk,local_648.m_data.object);
    makeBufferMemoryBarrier
              (&shaderWriteBarrier,0x40,0x2000,
               (VkBuffer)
               resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal,0,__n);
    iVar15 = 0;
    (*vk->_vptr_DeviceInterface[0x6d])
              (vk,local_648.m_data.object,0x8000,0x4000,0,0,0,1,&shaderWriteBarrier,0,0);
    endCommandBuffer(vk,local_648.m_data.object);
    submitCommandsAndWait(vk,device,local_5b0,local_648.m_data.object);
    pAVar11 = resultBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
    ::vk::invalidateMappedMemoryRange
              (vk,device,
               (VkDeviceMemory)
               ((resultBuffer.m_allocation.
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_memory).m_internal,
               (resultBuffer.m_allocation.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_offset,__n);
    uVar14 = *pAVar11->m_hostPtr;
    readInterleavedData<tcu::Vector<float,3>>
              (&resultTessCoords,(tessellation *)(ulong)uVar14,(int)pAVar11->m_hostPtr,(void *)0x10,
               0x10,iVar15);
    pvVar7 = allReferenceTessCoords.
             super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    log = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    uVar24 = (uint)(((long)allReferenceTessCoords.
                           super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar30].
                           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)allReferenceTessCoords.
                          super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar30].
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0xc);
    ppvVar1 = &shaderWriteBarrier.pNext;
    shaderWriteBarrier._0_8_ = log;
    if ((int)uVar14 < (int)uVar24) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
      std::operator<<((ostream *)ppvVar1,"Failure: generated ");
      std::ostream::operator<<(ppvVar1,uVar14);
      std::operator<<((ostream *)ppvVar1," coordinates, but the expected reference value is ");
      std::ostream::operator<<(ppvVar1,uVar24);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&shaderWriteBarrier,(EndMessageToken *)&tcu::TestLog::EndMessage)
      ;
    }
    else if (uVar14 == uVar24) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
      std::operator<<((ostream *)ppvVar1,"Note: generated ");
      std::ostream::operator<<(ppvVar1,uVar14);
      std::operator<<((ostream *)ppvVar1," tessellation coordinates");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&shaderWriteBarrier,(EndMessageToken *)&tcu::TestLog::EndMessage)
      ;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
      std::operator<<((ostream *)ppvVar1,"Note: generated ");
      std::ostream::operator<<(ppvVar1,uVar14);
      std::operator<<((ostream *)ppvVar1," coordinates (out of which ");
      std::ostream::operator<<(ppvVar1,uVar24);
      std::operator<<((ostream *)ppvVar1," must be unique)");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&shaderWriteBarrier,(EndMessageToken *)&tcu::TestLog::EndMessage)
      ;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar1);
    ppvVar1 = &shaderWriteBarrier.pNext;
    if (this->m_primitiveType - TESSPRIMITIVETYPE_QUADS < 2) {
      shaderWriteBarrier._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
      std::operator<<((ostream *)ppvVar1,
                      "Note: in the following visualization(s), u and v coordinate go left-to-right and bottom-to-top, respectively"
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&shaderWriteBarrier,(EndMessageToken *)&tcu::TestLog::EndMessage)
      ;
LAB_006f1c43:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar1);
    }
    else if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
      shaderWriteBarrier._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
      std::operator<<((ostream *)ppvVar1,
                      "Note: in the following visualization(s), the u=1, v=1, w=1 corners are at the right, top, and left corners, respectively"
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&shaderWriteBarrier,(EndMessageToken *)&tcu::TestLog::EndMessage)
      ;
      goto LAB_006f1c43;
    }
    TVar23 = this->m_primitiveType;
    tcu::Surface::Surface(&refVisual);
    tcu::Surface::Surface(&resVisual);
    coords = pvVar7 + uVar30;
    drawTessCoordVisualization(&refVisual,TVar23,coords);
    drawTessCoordVisualization(&resVisual,TVar23,&resultTessCoords);
    shaderWriteBarrier.sType = 0xffff0000;
    local_5a8 = coords;
    bVar12 = oneWayComparePointSets
                       (log,&refVisual,TVar23,coords,&resultTessCoords,"reference","result",
                        (RGBA *)&shaderWriteBarrier);
    shaderWriteBarrier.sType = 0xff0000ff;
    bVar13 = oneWayComparePointSets
                       (log,&resVisual,TVar23,&resultTessCoords,local_5a8,"result","reference",
                        (RGBA *)&shaderWriteBarrier);
    this_00 = (ostringstream *)(outer + 2);
    if (!bVar12 || !bVar13) {
      outer._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,
                      "Note: in the following reference visualization, points that are missing in result point set are blue (if any)"
                     );
      pTVar22 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)outer,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5d0,"RefTessCoordVisualization",&local_679);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_598,"Reference tessCoord visualization",&local_67a);
      pSVar26 = &refVisual;
      tcu::LogImage::LogImage
                ((LogImage *)&inner,&local_5d0,&local_598,pSVar26,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&inner,(int)pTVar22,__buf,(size_t)pSVar26);
      shaderWriteBarrier._0_8_ = pTVar22;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
      std::operator<<((ostream *)&shaderWriteBarrier.pNext,
                      "Note: in the following result visualization, points that are missing in reference point set are red (if any)"
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&shaderWriteBarrier,(EndMessageToken *)&tcu::TestLog::EndMessage)
      ;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
      tcu::LogImage::~LogImage((LogImage *)&inner);
      std::__cxx11::string::~string((string *)&local_598);
      std::__cxx11::string::~string((string *)&local_5d0);
      std::__cxx11::ostringstream::~ostringstream(this_00);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)outer,"ResTessCoordVisualization",(allocator<char> *)&local_5d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&inner,"Result tessCoord visualization",(allocator<char> *)&local_598);
    pSVar26 = &resVisual;
    tcu::LogImage::LogImage
              ((LogImage *)&shaderWriteBarrier,(string *)outer,(string *)&inner,pSVar26,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&shaderWriteBarrier,(int)log,__buf_00,(size_t)pSVar26);
    tcu::LogImage::~LogImage((LogImage *)&shaderWriteBarrier);
    std::__cxx11::string::~string((string *)&inner);
    std::__cxx11::string::~string((string *)outer);
    tcu::Surface::~Surface(&resVisual);
    tcu::Surface::~Surface(&refVisual);
    uVar31 = uVar31 + ((int)uVar24 <= (int)uVar14 && (bVar12 && bVar13));
    std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~_Vector_base
              (&resultTessCoords.
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>);
    uVar14 = (int)local_5a0 + 1;
  } while( true );
}

Assistant:

tcu::TestStatus TessCoordTestInstance::iterate (void)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Test data

	const std::vector<TessLevels>		 tessLevelCases			= genTessLevelCases(m_primitiveType, m_spacingMode);
	std::vector<std::vector<tcu::Vec3> > allReferenceTessCoords	(tessLevelCases.size());

	for (deUint32 i = 0; i < tessLevelCases.size(); ++i)
		allReferenceTessCoords[i] = generateReferenceTessCoords(m_primitiveType, m_spacingMode, &tessLevelCases[i].inner[0], &tessLevelCases[i].outer[0]);

	const size_t maxNumVertices = static_cast<int>(std::max_element(allReferenceTessCoords.begin(), allReferenceTessCoords.end(), SizeLessThan<std::vector<tcu::Vec3> >())->size());

	// Input buffer: tessellation levels. Data is filled in later.

	const Buffer tessLevelsBuffer(vk, device, allocator,
		makeBufferCreateInfo(sizeof(TessLevels), VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Output buffer: number of invocations + padding + tessellation coordinates. Initialized later.

	const int          resultBufferTessCoordsOffset	 = 4 * (int)sizeof(deInt32);
	const int          extraneousVertices			 = 16;	// allow some room for extraneous vertices from duplicate shader invocations (number is arbitrary)
	const VkDeviceSize resultBufferSizeBytes		 = resultBufferTessCoordsOffset + (maxNumVertices + extraneousVertices)*sizeof(tcu::Vec4);
	const Buffer       resultBuffer					 (vk, device, allocator, makeBufferCreateInfo(resultBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Descriptors

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet(makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));

	const VkDescriptorBufferInfo tessLevelsBufferInfo = makeDescriptorBufferInfo(tessLevelsBuffer.get(), 0ull, sizeof(TessLevels));
	const VkDescriptorBufferInfo resultBufferInfo     = makeDescriptorBufferInfo(resultBuffer.get(), 0ull, resultBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &tessLevelsBufferInfo)
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultBufferInfo)
		.update(vk, device);

	// Pipeline: set up vertex processing without rasterization

	const Unique<VkRenderPass>		renderPass		(makeRenderPassWithoutAttachments (vk, device));
	const Unique<VkFramebuffer>		framebuffer		(makeFramebufferWithoutAttachments(vk, device, *renderPass));
	const Unique<VkPipelineLayout>	pipelineLayout	(makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>		cmdPool			(makeCommandPool(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer		(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const Unique<VkPipeline> pipeline(GraphicsPipelineBuilder()
		.setShader(vk, device, VK_SHADER_STAGE_VERTEX_BIT,					m_context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader(vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	m_context.getBinaryCollection().get("tesc"), DE_NULL)
		.setShader(vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, m_context.getBinaryCollection().get("tese"), DE_NULL)
		.build    (vk, device, *pipelineLayout, *renderPass));

	deUint32 numPassedCases = 0;

	// Repeat the test for all tessellation coords cases
	for (deUint32 tessLevelCaseNdx = 0; tessLevelCaseNdx < tessLevelCases.size(); ++tessLevelCaseNdx)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "Tessellation levels: " << getTessellationLevelsString(tessLevelCases[tessLevelCaseNdx], m_primitiveType)
			<< tcu::TestLog::EndMessage;

		// Upload tessellation levels data to the input buffer
		{
			const Allocation& alloc = tessLevelsBuffer.getAllocation();
			TessLevels* const bufferTessLevels = static_cast<TessLevels*>(alloc.getHostPtr());
			*bufferTessLevels = tessLevelCases[tessLevelCaseNdx];
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), sizeof(TessLevels));
		}

		// Clear the results buffer
		{
			const Allocation& alloc = resultBuffer.getAllocation();
			deMemset(alloc.getHostPtr(), 0, static_cast<std::size_t>(resultBufferSizeBytes));
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);
		}

		// Reset the command buffer and begin recording.
		beginCommandBuffer(vk, *cmdBuffer);
		beginRenderPassWithRasterizationDisabled(vk, *cmdBuffer, *renderPass, *framebuffer);

		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
		vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

		// Process a single abstract vertex.
		vk.cmdDraw(*cmdBuffer, 1u, 1u, 0u, 0u);
		endRenderPass(vk, *cmdBuffer);

		{
			const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
				VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, resultBufferSizeBytes);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
		}

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);

		// Verify results
		{
			const Allocation& resultAlloc = resultBuffer.getAllocation();
			invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), resultBufferSizeBytes);

			const deInt32					numResults			= *static_cast<deInt32*>(resultAlloc.getHostPtr());
			const std::vector<tcu::Vec3>	resultTessCoords    = readInterleavedData<tcu::Vec3>(numResults, resultAlloc.getHostPtr(), resultBufferTessCoordsOffset, sizeof(tcu::Vec4));
			const std::vector<tcu::Vec3>&	referenceTessCoords = allReferenceTessCoords[tessLevelCaseNdx];
			const int						numExpectedResults  = static_cast<int>(referenceTessCoords.size());
			tcu::TestLog&					log					= m_context.getTestContext().getLog();

			if (numResults < numExpectedResults)
			{
				log << tcu::TestLog::Message
					<< "Failure: generated " << numResults << " coordinates, but the expected reference value is " << numExpectedResults
					<< tcu::TestLog::EndMessage;
			}
			else if (numResults == numExpectedResults)
				log << tcu::TestLog::Message << "Note: generated " << numResults << " tessellation coordinates" << tcu::TestLog::EndMessage;
			else
			{
				log << tcu::TestLog::Message
					<< "Note: generated " << numResults << " coordinates (out of which " << numExpectedResults << " must be unique)"
					<< tcu::TestLog::EndMessage;
			}

			if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
				log << tcu::TestLog::Message << "Note: in the following visualization(s), the u=1, v=1, w=1 corners are at the right, top, and left corners, respectively" << tcu::TestLog::EndMessage;
			else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS || m_primitiveType == TESSPRIMITIVETYPE_ISOLINES)
				log << tcu::TestLog::Message << "Note: in the following visualization(s), u and v coordinate go left-to-right and bottom-to-top, respectively" << tcu::TestLog::EndMessage;
			else
				DE_ASSERT(false);

			if (compareTessCoords(log, m_primitiveType, referenceTessCoords, resultTessCoords) && (numResults >= numExpectedResults))
				++numPassedCases;
		}
	}  // for tessLevelCaseNdx

	return (numPassedCases == tessLevelCases.size() ? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Some cases have failed"));
}